

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

qpdf_offset_t __thiscall
QPDF::processXRefStream(QPDF *this,qpdf_offset_t xref_offset,QPDFObjectHandle *xref_obj)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  byte bVar4;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var5;
  undefined8 uVar6;
  undefined8 f1;
  undefined8 uVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  size_t j;
  size_t __val;
  long *plVar11;
  QPDFObjGen *pQVar12;
  byte *pbVar13;
  pointer ppVar14;
  long lVar15;
  longlong lVar16;
  QPDFExc *pQVar17;
  ulong uVar18;
  long *plVar19;
  QPDFObjGen QVar20;
  size_t sVar21;
  int iVar22;
  char cVar23;
  _Any_data *dict_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  _Any_data *this_00;
  ulong uVar26;
  pair<int,_int> pVar27;
  string_view msg;
  QPDFObjectHandle dict;
  string __str_1;
  anon_class_16_2_099dce64 damaged;
  shared_ptr<Buffer> bp;
  QPDFExc x;
  string __str;
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  string local_230;
  uint local_210;
  undefined4 uStack_20c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208 [2];
  QPDFObjGen local_1f8;
  QPDFObjGen local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  QPDFObjGen QStack_1e0;
  anon_class_16_2_099dce64 local_1d8;
  QPDFObjectHandle local_1c8;
  pair<int,_std::array<int,_3UL>_> local_1b8;
  undefined1 local_1a8 [128];
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_128;
  pointer local_108;
  pointer local_100;
  qpdf_offset_t local_f8;
  ulong local_f0;
  void *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  uint local_b0;
  long local_a8 [2];
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this_00 = (_Any_data *)&local_230;
  local_1d8.this = this;
  local_1d8.xref_offset = xref_offset;
  local_f8 = xref_offset;
  QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_230);
  local_58._M_unused._M_object = local_1d8.this;
  local_58._8_8_ = local_1d8.xref_offset;
  pcStack_40 = std::
               _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_manager;
  local_1b8 = processXRefW((QPDF *)this_00,(QPDFObjectHandle *)&local_230,
                           (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>
                            *)&local_58);
  if (local_48 != (code *)0x0) {
    this_00 = &local_58;
    (*local_48)(this_00,this_00,__destroy_functor);
  }
  iVar22 = local_1b8.first;
  local_78._M_unused._M_object = local_1d8.this;
  local_78._8_8_ = local_1d8.xref_offset;
  pcStack_60 = std::
               _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_manager;
  dict_00 = (_Any_data *)&local_230;
  iVar10 = processXRefSize((QPDF *)this_00,(QPDFObjectHandle *)dict_00,local_1b8.first,
                           (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>
                            *)&local_78);
  if (local_68 != (code *)0x0) {
    dict_00 = &local_78;
    (*local_68)(dict_00,dict_00,__destroy_functor);
  }
  local_98._M_unused._M_object = local_1d8.this;
  local_98._8_8_ = local_1d8.xref_offset;
  pcStack_80 = std::
               _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_manager;
  processXRefIndex(&local_128,(QPDF *)dict_00,(QPDFObjectHandle *)&local_230,iVar10,
                   (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
                   &local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  QPDFObjectHandle::getStreamData(&local_1c8,(qpdf_stream_decode_level_e)xref_obj);
  __val = Buffer::getSize((Buffer *)
                          local_1c8.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar22 < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar22);
  }
  if (local_128.first < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(local_128.first);
  }
  uVar26 = (long)local_128.first * (long)iVar22;
  if (uVar26 - __val == 0) goto LAB_0022bc46;
  cVar23 = '\x01';
  if (9 < uVar26) {
    uVar18 = uVar26;
    cVar8 = '\x04';
    do {
      cVar23 = cVar8;
      if (uVar18 < 100) {
        cVar23 = cVar23 + -2;
        goto LAB_0022b95b;
      }
      if (uVar18 < 1000) {
        cVar23 = cVar23 + -1;
        goto LAB_0022b95b;
      }
      if (uVar18 < 10000) goto LAB_0022b95b;
      bVar9 = 99999 < uVar18;
      uVar18 = uVar18 / 10000;
      cVar8 = cVar23 + '\x04';
    } while (bVar9);
    cVar23 = cVar23 + '\x01';
  }
LAB_0022b95b:
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar23);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,uVar26);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x281b92);
  plVar19 = plVar11 + 2;
  if ((long *)*plVar11 == plVar19) {
    local_c8 = *plVar19;
    lStack_c0 = plVar11[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar19;
    local_d8 = (long *)*plVar11;
  }
  local_d0 = plVar11[1];
  *plVar11 = (long)plVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  pQVar12 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_d8);
  QVar20 = (QPDFObjGen)(pQVar12 + 2);
  if (*pQVar12 == QVar20) {
    local_1e8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)QVar20;
    QStack_1e0 = pQVar12[3];
    local_1f8 = (QPDFObjGen)&local_1e8;
  }
  else {
    local_1e8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)QVar20;
    local_1f8 = *pQVar12;
  }
  local_1f0 = pQVar12[1];
  *pQVar12 = QVar20;
  pQVar12[1].obj = 0;
  pQVar12[1].gen = 0;
  *(undefined1 *)&pQVar12[2].obj = 0;
  cVar23 = '\x01';
  if (9 < __val) {
    sVar21 = __val;
    cVar8 = '\x04';
    do {
      cVar23 = cVar8;
      if (sVar21 < 100) {
        cVar23 = cVar23 + -2;
        goto LAB_0022bab0;
      }
      if (sVar21 < 1000) {
        cVar23 = cVar23 + -1;
        goto LAB_0022bab0;
      }
      if (sVar21 < 10000) goto LAB_0022bab0;
      bVar9 = 99999 < sVar21;
      sVar21 = sVar21 / 10000;
      cVar8 = cVar23 + '\x04';
    } while (bVar9);
    cVar23 = cVar23 + '\x01';
  }
LAB_0022bab0:
  local_230.field_2._8_8_ = local_208;
  std::__cxx11::string::_M_construct((ulong)((long)&local_230.field_2 + 8),cVar23);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_230.field_2._8_8_,local_210,__val);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (CONCAT44(uStack_20c,local_210) + (long)local_1f0);
  p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if (local_1f8 != (QPDFObjGen)&local_1e8) {
    p_Var24 = local_1e8;
  }
  if (p_Var24 < p_Var2) {
    _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_230.field_2._8_8_ != local_208) {
      _Var25._M_pi = local_208[0]._M_pi;
    }
    if (_Var25._M_pi < p_Var2) goto LAB_0022bb18;
    plVar11 = (long *)std::__cxx11::string::replace
                                ((ulong)((long)&local_230.field_2 + 8),0,(char *)0x0,
                                 (ulong)local_1f8);
  }
  else {
LAB_0022bb18:
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,local_230.field_2._8_8_);
  }
  local_258._0_8_ = local_248;
  peVar1 = (element_type *)(plVar11 + 2);
  if ((element_type *)*plVar11 == peVar1) {
    local_248._0_8_ =
         *(undefined8 *)
          &(peVar1->value).
           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    ;
    local_248._8_8_ = plVar11[3];
  }
  else {
    local_248._0_8_ =
         *(undefined8 *)
          &(peVar1->value).
           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    ;
    local_258._0_8_ = (element_type *)*plVar11;
  }
  local_258._8_8_ = plVar11[1];
  *plVar11 = (long)peVar1;
  plVar11[1] = 0;
  *(undefined1 *)
   &(peVar1->value).
    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       = 0;
  msg._M_str = (char *)peVar1;
  msg._M_len = local_258._0_8_;
  processXRefStream::anon_class_16_2_099dce64::operator()((QPDFExc *)local_1a8,&local_1d8,msg);
  if ((element_type *)local_258._0_8_ != (element_type *)local_248) {
    operator_delete((void *)local_258._0_8_,local_248._0_8_ + 1);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_230.field_2._8_8_ != local_208) {
    operator_delete((void *)local_230.field_2._8_8_,
                    (ulong)((long)&(local_208[0]._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (local_1f8 != (QPDFObjGen)&local_1e8) {
    operator_delete((void *)local_1f8,(ulong)((long)&local_1e8->_vptr__Sp_counted_base + 1));
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (__val <= uVar26 && uVar26 - __val != 0) {
    pQVar17 = (QPDFExc *)__cxa_allocate_exception(0x80);
    QPDFExc::QPDFExc(pQVar17,(QPDFExc *)local_1a8);
    __cxa_throw(pQVar17,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  warn(this,(QPDFExc *)local_1a8);
  QPDFExc::~QPDFExc((QPDFExc *)local_1a8);
LAB_0022bc46:
  pbVar13 = Buffer::getBuffer((Buffer *)
                              local_1c8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_108 = local_128.second.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
  if (local_128.second.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.second.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_230.field_2._M_allocated_capacity._4_4_ = local_1b8.second._M_elems[0];
    local_248._16_8_ = 0;
    ppVar14 = local_128.second.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      pVar27 = *ppVar14;
      local_f0 = (ulong)pVar27 >> 0x20;
      local_100 = ppVar14;
      if (0 < pVar27.second) {
        iVar22 = 0;
        do {
          local_1a8._0_8_ = (pointer)0x0;
          local_1a8._8_8_ = 0;
          local_1a8._16_8_ = 0;
          if (local_230.field_2._M_allocated_capacity._4_4_ == 0) {
            local_1a8._0_8_ = (pointer)0x1;
          }
          local_1a8._1_7_ = 0;
          local_1a8[0] = local_230.field_2._M_allocated_capacity._4_4_ == 0;
          lVar15 = 0;
          do {
            iVar10 = local_1b8.second._M_elems[lVar15];
            if (0 < iVar10) {
              uVar26 = *(ulong *)(local_1a8 + lVar15 * 8);
              do {
                *(ulong *)(local_1a8 + lVar15 * 8) = uVar26 << 8;
                bVar4 = *pbVar13;
                pbVar13 = pbVar13 + 1;
                uVar26 = uVar26 << 8 | (ulong)bVar4;
                *(ulong *)(local_1a8 + lVar15 * 8) = uVar26;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
            uVar6 = local_1a8._0_8_;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          if ((local_248._16_8_ & 1) == 0) {
            local_248._16_8_ = local_248._16_8_ & 0xff;
            if ((pointer)local_1a8._0_8_ == (pointer)0x2) {
              local_248._16_8_ = 1;
            }
          }
          else if ((pointer)local_1a8._0_8_ != (pointer)0x2) {
            ((this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
            uncompressed_after_compressed = true;
          }
          iVar10 = pVar27.first;
          if (iVar10 == 0) {
            ((this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->first_xref_item_offset =
                 local_f8;
          }
          else if ((pointer)local_1a8._0_8_ == (pointer)0x0) {
            insertFreeXrefEntry(this,(QPDFObjGen)((ulong)pVar27 & 0xffffffff));
          }
          else {
            if ((pointer)(local_1a8._0_8_ + -0x80000000) < (pointer)0xffffffff00000000) {
              QIntC::IntConverter<long_long,_int,_true,_true>::error(local_1a8._0_8_);
            }
            uVar7 = local_1a8._16_8_;
            f1 = local_1a8._8_8_;
            if (local_1a8._16_8_ - 0x80000000 < 0xffffffff00000000) {
              QIntC::IntConverter<long_long,_int,_true,_true>::error(local_1a8._16_8_);
            }
            insertXrefEntry(this,iVar10,(int)uVar6,f1,(int)uVar7);
          }
          pVar27.first = iVar10 + 1;
          pVar27.second = 0;
          iVar22 = iVar22 + 1;
        } while (iVar22 != (int)local_f0);
      }
      ppVar14 = local_100 + 1;
    } while (ppVar14 != local_108);
  }
  if (*(long *)&(((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer).
                super_BaseHandle == 0) {
    local_e8 = local_230._M_dataplus._M_p;
    local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_230._M_string_length + 8) =
             *(_Atomic_word *)(local_230._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_230._M_string_length + 8) =
             *(_Atomic_word *)(local_230._M_string_length + 8) + 1;
      }
    }
    _Var5._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(long *)&((_Var5._M_head_impl)->trailer).super_BaseHandle == 0) {
      *(pointer *)&((_Var5._M_head_impl)->trailer).super_BaseHandle = local_230._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(_Var5._M_head_impl)->trailer + 8),&local_e0);
    }
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
    }
  }
  pcVar3 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/Prev","");
  bVar9 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_230,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (bVar9) {
    local_1a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/Prev","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_258,&local_230);
    bVar9 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    if ((pointer)local_1a8._0_8_ != pcVar3) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar9) {
      pQVar17 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_1a8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"xref stream","");
      local_258._0_8_ = local_248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,"/Prev key in xref stream dictionary is not an integer","");
      damagedPDF(pQVar17,this,(string *)local_1a8,(string *)local_258);
      __cxa_throw(pQVar17,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_1a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/Prev","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_258,&local_230);
    lVar16 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_258);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
    }
    if ((pointer)local_1a8._0_8_ != pcVar3) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  else {
    lVar16 = 0;
  }
  if (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_128.second.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.second.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.second.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.second.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length);
  }
  return lVar16;
}

Assistant:

qpdf_offset_t
QPDF::processXRefStream(qpdf_offset_t xref_offset, QPDFObjectHandle& xref_obj)
{
    auto damaged = [this, xref_offset](std::string_view msg) -> QPDFExc {
        return damagedPDF("xref stream", xref_offset, msg.data());
    };

    auto dict = xref_obj.getDict();

    auto [entry_size, W] = processXRefW(dict, damaged);
    int max_num_entries = processXRefSize(dict, entry_size, damaged);
    auto [num_entries, indx] = processXRefIndex(dict, max_num_entries, damaged);

    std::shared_ptr<Buffer> bp = xref_obj.getStreamData(qpdf_dl_specialized);
    size_t actual_size = bp->getSize();
    auto expected_size = toS(entry_size) * toS(num_entries);

    if (expected_size != actual_size) {
        QPDFExc x = damaged(
            "Cross-reference stream data has the wrong size; expected = " +
            std::to_string(expected_size) + "; actual = " + std::to_string(actual_size));
        if (expected_size > actual_size) {
            throw x;
        } else {
            warn(x);
        }
    }

    bool saw_first_compressed_object = false;

    // Actual size vs. expected size check above ensures that we will not overflow any buffers here.
    // We know that entry_size * num_entries is less or equal to the size of the buffer.
    auto p = bp->getBuffer();
    for (auto [obj, sec_entries]: indx) {
        // Process a subsection.
        for (int i = 0; i < sec_entries; ++i) {
            // Read this entry
            std::array<qpdf_offset_t, 3> fields{};
            if (W[0] == 0) {
                QTC::TC("qpdf", "QPDF default for xref stream field 0");
                fields[0] = 1;
            }
            for (size_t j = 0; j < 3; ++j) {
                for (int k = 0; k < W[j]; ++k) {
                    fields[j] <<= 8;
                    fields[j] |= *p++;
                }
            }

            // Get the generation number.  The generation number is 0 unless this is an uncompressed
            // object record, in which case the generation number appears as the third field.
            if (saw_first_compressed_object) {
                if (fields[0] != 2) {
                    m->uncompressed_after_compressed = true;
                }
            } else if (fields[0] == 2) {
                saw_first_compressed_object = true;
            }
            if (obj == 0) {
                // This is needed by checkLinearization()
                m->first_xref_item_offset = xref_offset;
            } else if (fields[0] == 0) {
                // Ignore fields[2], which we don't care about in this case. This works around the
                // issue of some PDF files that put invalid values, like -1, here for deleted
                // objects.
                insertFreeXrefEntry(QPDFObjGen(obj, 0));
            } else {
                insertXrefEntry(obj, toI(fields[0]), fields[1], toI(fields[2]));
            }
            ++obj;
        }
    }

    if (!m->trailer) {
        setTrailer(dict);
    }

    if (dict.hasKey("/Prev")) {
        if (!dict.getKey("/Prev").isInteger()) {
            throw damagedPDF(
                "xref stream", "/Prev key in xref stream dictionary is not an integer");
        }
        QTC::TC("qpdf", "QPDF prev key in xref stream dictionary");
        return dict.getKey("/Prev").getIntValue();
    } else {
        return 0;
    }
}